

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O3

int rtosc_count_printed_arg_vals_of_msg(char *msg)

{
  char *pcVar1;
  int iVar2;
  ulong in_RAX;
  ushort **ppuVar3;
  char cVar4;
  undefined8 uStack_28;
  
  cVar4 = *msg;
  uStack_28 = in_RAX;
  while (cVar4 != '\0') {
    iVar2 = isspace((int)cVar4);
    if (iVar2 == 0) goto LAB_0010645e;
    pcVar1 = msg + 1;
    msg = msg + 1;
    cVar4 = *pcVar1;
  }
  cVar4 = '\0';
LAB_0010645e:
  while (cVar4 == '%') {
    uStack_28 = uStack_28 & 0xffffffff;
    __isoc99_sscanf(msg,"%*[^\n] %n",(long)&uStack_28 + 4);
    pcVar1 = msg + uStack_28._4_4_;
    msg = msg + uStack_28._4_4_;
    cVar4 = *pcVar1;
  }
  if (cVar4 == '\0') {
    iVar2 = -0x80000000;
  }
  else if (cVar4 == '/') {
    ppuVar3 = __ctype_b_loc();
    cVar4 = '/';
    do {
      if ((*(byte *)((long)*ppuVar3 + (long)cVar4 * 2 + 1) & 0x20) != 0) break;
      cVar4 = msg[1];
      msg = msg + 1;
    } while (cVar4 != '\0');
    iVar2 = rtosc_count_printed_arg_vals(msg);
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int rtosc_count_printed_arg_vals_of_msg(const char* msg)
{
    skip_while(&msg, isspace);
    while (*msg == '%')
        skip_fmt(&msg, "%*[^\n] %n");

    if (*msg == '/') {
        for(; *msg && !isspace(*msg); ++msg);
        return rtosc_count_printed_arg_vals(msg);
    }
    else if(!*msg)
        return INT_MIN;
    else
        return -1;
}